

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

CborError jsonObjectToCbor(CborEncoder *parent,QJsonObject *o)

{
  bool bVar1;
  CborError CVar2;
  CborEncoder *in_RDI;
  long in_FS_OFFSET;
  QByteArray key;
  CborEncoder map;
  const_iterator end;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  CborEncoder *in_stack_ffffffffffffff40;
  QJsonObject *in_stack_ffffffffffffff48;
  QJsonValue *in_stack_ffffffffffffff78;
  CborEncoder *in_stack_ffffffffffffff80;
  QByteArray local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 local_40 [16];
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_30;
  undefined1 *local_28;
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)&DAT_aaaaaaaaaaaaaaaa;
  _local_30 = (QJsonValueConstRef)QJsonObject::constBegin(in_stack_ffffffffffffff48);
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = (undefined1  [16])QJsonObject::constEnd(in_stack_ffffffffffffff48);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::size();
  cbor_encoder_create_map
            (in_RDI,in_stack_ffffffffffffff40,
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    bVar1 = operator!=((const_iterator *)in_stack_ffffffffffffff40,
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (!bVar1) break;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::const_iterator::key
              ((const_iterator *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QString::toUtf8((QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QString::~QString((QString *)0x112458);
    in_stack_ffffffffffffff40 = (CborEncoder *)QByteArray::constData((QByteArray *)0x112462);
    QByteArray::size(&local_78);
    cbor_encode_text_string
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0x112483);
    QJsonObject::const_iterator::value((const_iterator *)in_RDI);
    QJsonValueConstRef::operator_cast_to_QJsonValue((QJsonValueConstRef *)in_stack_ffffffffffffff40)
    ;
    jsonValueToCbor(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QJsonValue::~QJsonValue(local_20);
    QByteArray::~QByteArray((QByteArray *)0x1124d5);
    QJsonObject::const_iterator::operator++((const_iterator *)&local_30);
  }
  CVar2 = cbor_encoder_close_container
                    ((CborEncoder *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (CborEncoder *)0x1124f6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

static CborError jsonObjectToCbor(CborEncoder *parent, const QJsonObject &o)
{
    auto it = o.constBegin();
    auto end = o.constEnd();
    CborEncoder map;
    cbor_encoder_create_map(parent, &map, o.size());

    for ( ; it != end; ++it) {
        QByteArray key = it.key().toUtf8();
        cbor_encode_text_string(&map, key.constData(), key.size());
        jsonValueToCbor(&map, it.value());
    }
    return cbor_encoder_close_container(parent, &map);
}